

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O0

ostream * __thiscall amrex::DistributionMapping::writeOn(DistributionMapping *this,ostream *os)

{
  int iVar1;
  ostream *poVar2;
  Long LVar3;
  ulong uVar4;
  ostream *in_RSI;
  char *in_RDI;
  int i;
  int in_stack_ffffffffffffffbc;
  int local_1c;
  
  poVar2 = std::operator<<(in_RSI,'(');
  LVar3 = size((DistributionMapping *)0xf5d0f6);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,LVar3);
  std::operator<<(poVar2,'\n');
  for (local_1c = 0; LVar3 = size((DistributionMapping *)0xf5d12c), local_1c < LVar3;
      local_1c = local_1c + 1) {
    poVar2 = in_RSI;
    iVar1 = operator[]((DistributionMapping *)in_RSI,in_stack_ffffffffffffffbc);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
    std::operator<<(poVar2,'\n');
  }
  std::operator<<(in_RSI,')');
  uVar4 = std::ios::fail();
  if ((uVar4 & 1) != 0) {
    Error_host(in_RDI);
  }
  return in_RSI;
}

Assistant:

std::ostream&
DistributionMapping::writeOn (std::ostream& os) const
{
    os << '(' << size() << '\n';
    for (int i = 0; i < size(); ++i) {
        os << (*this)[i] << '\n';
    }
    os << ')';
    if (os.fail()) {
        amrex::Error("DistributionMapping::writeOn(ostream&) failed");
    }
    return os;
}